

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O3

void __thiscall dynet::ComputationGraph::_revert(ComputationGraph *this,CGCheckpoint p)

{
  pointer ppNVar1;
  pointer ppNVar2;
  int i;
  long lVar3;
  
  (**(code **)(*dynet::default_device + 0x18))(dynet::default_device,&p.device_mem_checkpoint);
  ppNVar1 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar3 = (long)p.node_idx;
  if (p.node_idx < (int)((ulong)((long)ppNVar2 - (long)ppNVar1) >> 3)) {
    do {
      if (ppNVar1[lVar3] != (Node *)0x0) {
        (*ppNVar1[lVar3]->_vptr_Node[1])();
        ppNVar1 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppNVar2 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)ppNVar2 - (long)ppNVar1) >> 3));
    std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::resize
              (&this->nodes,(long)p.node_idx);
    (*this->ee->_vptr_ExecutionEngine[3])(this->ee,(ulong)(p.node_idx - 1));
  }
  if (p.par_node_idx <
      (int)((ulong)((long)(this->parameter_nodes).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->parameter_nodes).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->parameter_nodes,(long)p.par_node_idx);
  }
  return;
}

Assistant:

void ComputationGraph::_revert(CGCheckpoint p) {
  default_device->revert(p.device_mem_checkpoint);
  // clear all nodes at position >= p.node_idx
  if ((int)nodes.size() > p.node_idx) {
    for(int i = p.node_idx; i < (int)nodes.size(); i++)
      delete nodes[i]; // the deletion of nodes.
    nodes.resize(p.node_idx);
    ee->invalidate(p.node_idx - 1); // clear precomputed forward values
  }
  // clear all parameter nodes at position >= p.par_node_idx
  if ((int)parameter_nodes.size() > p.par_node_idx) {
    parameter_nodes.resize(p.par_node_idx);
  }
}